

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  Message *pMVar1;
  bool bVar2;
  Label LVar3;
  CppType CVar4;
  int iVar5;
  Descriptor *pDVar6;
  ExtensionSet *this_00;
  OneofDescriptor *pOVar7;
  Message **ppMVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Message *default_message_1;
  Message *default_message;
  Message **result_holder;
  Message *result;
  MessageFactory *factory_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar6 = FieldDescriptor::containing_type(field);
  if (pDVar6 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  LVar3 = FieldDescriptor::label(field);
  if (LVar3 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar4 = FieldDescriptor::cpp_type(field);
  if (CVar4 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  result = (Message *)factory;
  if (factory == (MessageFactory *)0x0) {
    result = (Message *)this->message_factory_;
  }
  bVar2 = FieldDescriptor::is_extension(field);
  if (bVar2) {
    this_00 = MutableExtensionSet(this,message);
    this_local = (GeneratedMessageReflection *)
                 ExtensionSet::MutableMessage(this_00,field,(MessageFactory *)result);
  }
  else {
    default_message = (Message *)MutableRaw<google::protobuf::Message*>(this,message,field);
    pOVar7 = FieldDescriptor::containing_oneof(field);
    if (pOVar7 == (OneofDescriptor *)0x0) {
      SetBit(this,message,field);
    }
    else {
      bVar2 = HasOneofField(this,message,field);
      if (!bVar2) {
        pOVar7 = FieldDescriptor::containing_oneof(field);
        ClearOneof(this,message,pOVar7);
        default_message = (Message *)MutableField<google::protobuf::Message*>(this,message,field);
        ppMVar8 = DefaultRaw<google::protobuf::Message_const*>(this,field);
        pMVar1 = *ppMVar8;
        iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[5])();
        iVar5 = (*(pMVar1->super_MessageLite)._vptr_MessageLite[4])
                          (pMVar1,CONCAT44(extraout_var,iVar5));
        (default_message->super_MessageLite)._vptr_MessageLite =
             (_func_int **)CONCAT44(extraout_var_00,iVar5);
      }
    }
    if ((default_message->super_MessageLite)._vptr_MessageLite == (_func_int **)0x0) {
      ppMVar8 = DefaultRaw<google::protobuf::Message_const*>(this,field);
      pMVar1 = *ppMVar8;
      iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[5])();
      iVar5 = (*(pMVar1->super_MessageLite)._vptr_MessageLite[4])
                        (pMVar1,CONCAT44(extraout_var_01,iVar5));
      (default_message->super_MessageLite)._vptr_MessageLite =
           (_func_int **)CONCAT44(extraout_var_02,iVar5);
    }
    this_local = (GeneratedMessageReflection *)
                 (default_message->super_MessageLite)._vptr_MessageLite;
  }
  return (Message *)this_local;
}

Assistant:

Message* GeneratedMessageReflection::MutableMessage(
    Message* message, const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (field->containing_oneof()) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = DefaultRaw<const Message*>(field);
        *result_holder = default_message->New(message->GetArena());
      }
    } else {
      SetBit(message, field);
    }

    if (*result_holder == NULL) {
      const Message* default_message = DefaultRaw<const Message*>(field);
      *result_holder = default_message->New(message->GetArena());
    }
    result = *result_holder;
    return result;
  }
}